

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cmdline.c
# Opt level: O3

void test_unknown_short_option(void)

{
  int iVar1;
  undefined8 in_RAX;
  
  iVar1 = cmdline_read(test_unknown_short_option::optlist,2,test_unknown_short_option::argv,
                       test_unknown_short_option_callback,(void *)0x0);
  acutest_check_((uint)(iVar1 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-cmdline.c"
                 ,0x4b,"%s","ret == -1",in_RAX);
  return;
}

Assistant:

static void
test_unknown_short_option(void)
{
    static const CMDLINE_OPTION optlist[] = { { 0 } };
    static char* argv[] = { "foo", "-X" };
    static const int argc = sizeof(argv) / sizeof(argv[0]);
    int ret;

    ret = cmdline_read(optlist, argc, argv, test_unknown_short_option_callback, NULL);
    TEST_CHECK(ret == -1);
}